

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  float *pfVar1;
  undefined8 *puVar2;
  ImVec2 IVar3;
  short sVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow *pIVar6;
  ImGuiPtrOrIndex *__src;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  uint uVar10;
  ImPool<ImGuiTable> *this;
  bool bVar11;
  ImU32 IVar12;
  ImPoolIdx IVar13;
  int iVar14;
  ImGuiTable *p;
  char *pcVar15;
  ImGuiPtrOrIndex *__dest;
  ImGuiTableColumn *pIVar16;
  byte bVar17;
  byte bVar18;
  uint uVar19;
  int iVar20;
  ImRect *pIVar21;
  ImGuiTableCellData *pIVar22;
  byte bVar23;
  long lVar24;
  ImGuiTableColumn *pIVar25;
  ImGuiID key;
  undefined4 in_register_00000034;
  ImGuiID id_00;
  int iVar26;
  ulong uVar27;
  ImGuiTableColumn *pIVar28;
  ImS16 IVar29;
  char *pcVar30;
  ImGuiContext *pIVar31;
  ImGuiContext *g;
  uint uVar32;
  ImVec2 IVar33;
  float fVar34;
  undefined1 in_register_00001204 [12];
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  ImRect outer_rect;
  ImVec2 local_88;
  uint local_7c;
  ImGuiWindow *local_78;
  ImGuiContext *local_70;
  undefined1 local_68 [16];
  ImPool<ImGuiTable> *local_50;
  ImRect local_48;
  char *local_38;
  
  pIVar31 = GImGui;
  local_68._4_12_ = in_register_00001204;
  local_68._0_4_ = inner_width;
  local_78 = (ImGuiWindow *)CONCAT44(in_register_00000034,id);
  pIVar5 = GImGui->CurrentWindow;
  pIVar5->WriteAccessed = true;
  if (pIVar5->SkipItems != false) {
    return false;
  }
  if (0x3f < columns_count - 1U) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x1f3d,"BeginTableEx","ImGui ASSERT FAILED: %s",
                "columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && \"Only 1..64 columns allowed!\""
               );
  }
  if ((((uint)flags >> 0x14 & 1) != 0) && (local_68._0_4_ < 0.0)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,7999,"BeginTableEx","ImGui ASSERT FAILED: %s","inner_width >= 0.0f");
  }
  IVar33 = GetContentRegionAvail();
  fVar35 = IVar33.x;
  fVar34 = IVar33.y;
  if (fVar35 <= 1.0) {
    fVar35 = 1.0;
  }
  if ((flags & 0x300000U) == 0) {
    IVar33 = CalcItemSize(*outer_size,fVar35,0.0);
    local_48.Min.x = (pIVar5->DC).CursorPos.x;
    local_48.Min.y = (pIVar5->DC).CursorPos.y;
    local_48.Max.x = IVar33.x + local_48.Min.x;
    local_48.Max.y = IVar33.y + local_48.Min.y;
  }
  else {
    if (fVar34 <= 1.0) {
      fVar34 = 1.0;
    }
    IVar33 = CalcItemSize(*outer_size,fVar35,fVar34);
    local_48.Min.x = (pIVar5->DC).CursorPos.x;
    local_48.Min.y = (pIVar5->DC).CursorPos.y;
    local_48.Max.x = IVar33.x + local_48.Min.x;
    local_48.Max.y = IVar33.y + local_48.Min.y;
    bVar11 = IsClippedEx(&local_48,0,false);
    if (bVar11) {
      ItemSize(&local_48,-1.0);
      return false;
    }
  }
  IVar29 = 0;
  uVar32 = (uint)(((uint)flags >> 0x14 & 1) == 0) * 0x8000 + 0x8000;
  if ((flags & 0x18000U) != 0) {
    uVar32 = 0;
  }
  uVar19 = (uint)flags >> 1 & 8 | uVar32 | flags;
  uVar32 = uVar19 | 0x20;
  if ((uVar19 & 0xf) != 0) {
    uVar32 = uVar19;
  }
  uVar19 = uVar32 & 0xfcefffff;
  if ((uVar32 >> 0x14 & 1) != 0) {
    uVar19 = uVar32;
  }
  uVar10 = uVar19 & 0xff1fffff;
  if ((uVar19 >> 0x15 & 1) != 0) {
    uVar10 = uVar19;
  }
  uVar19 = uVar10 & 0xfffbffff;
  if ((uVar10 & 0x300000) == 0) {
    uVar19 = uVar10;
  }
  uVar10 = uVar19 & 0xffffbfff;
  if ((uVar19 & 0x3000000) == 0) {
    uVar10 = uVar19;
  }
  uVar19 = pIVar5->Flags;
  local_50 = &pIVar31->Tables;
  key = (ImGuiID)local_78;
  local_38 = name;
  p = ImPool<ImGuiTable>::GetOrAddByKey(local_50,key);
  local_7c = p->Flags;
  iVar14 = p->LastFrameActive;
  local_70 = pIVar31;
  iVar20 = pIVar31->FrameCount;
  id_00 = key;
  if (iVar14 == pIVar31->FrameCount) {
    sVar4 = p->InstanceCurrent;
    IVar29 = sVar4 + 1;
    id_00 = (int)sVar4 + key + 1;
    iVar20 = iVar14;
    if ((-1 < sVar4) && (p->ColumnsCount != columns_count)) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1f57,"BeginTableEx","ImGui ASSERT FAILED: %s",
                  "table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                 );
      key = (ImGuiID)local_78;
      iVar20 = local_70->FrameCount;
    }
  }
  pIVar31 = local_70;
  p->ID = key;
  p->Flags = uVar19 >> 3 & 0x20 | (uVar32 & 1) << 9 | uVar10;
  p->InstanceCurrent = IVar29;
  p->LastFrameActive = iVar20;
  p->InnerWindow = pIVar5;
  p->OuterWindow = pIVar5;
  p->ColumnsCount = columns_count;
  fVar35 = (float)local_68._0_4_;
  if ((p->ColumnsNames).Buf.Capacity < 0) {
    pcVar15 = (char *)MemAlloc(0);
    pcVar30 = (p->ColumnsNames).Buf.Data;
    if (pcVar30 != (char *)0x0) {
      memcpy(pcVar15,pcVar30,(long)(p->ColumnsNames).Buf.Size);
      MemFree((p->ColumnsNames).Buf.Data);
    }
    (p->ColumnsNames).Buf.Data = pcVar15;
    (p->ColumnsNames).Buf.Capacity = 0;
    fVar35 = (float)local_68._0_4_;
  }
  (p->ColumnsNames).Buf.Size = 0;
  p->IsInitializing = false;
  p->IsLayoutLocked = false;
  p->InnerWidth = fVar35;
  IVar33.y = local_48.Min.y;
  IVar33.x = local_48.Min.x;
  IVar8.y = local_48.Max.y;
  IVar8.x = local_48.Max.x;
  (p->OuterRect).Min = IVar33;
  (p->OuterRect).Max = IVar8;
  IVar3.y = local_48.Min.y;
  IVar3.x = local_48.Min.x;
  IVar9.y = local_48.Max.y;
  IVar9.x = local_48.Max.x;
  (p->WorkRect).Min = IVar3;
  (p->WorkRect).Max = IVar9;
  if ((flags & 0x300000U) != 0) {
    bVar11 = 0.0 < fVar35;
    if ((uVar10 & 0x100000) == 0) {
      fVar35 = 3.4028235e+38;
    }
    fVar35 = (float)(~-(uint)bVar11 & 0x7f7fffff | (uint)fVar35 & -(uint)bVar11);
    if (fVar35 != 3.4028235e+38 || (uVar10 & 0x300000) == 0x100000) {
      if ((uVar10 & 0x300000) == 0x100000) {
        local_88.y = 1.1754944e-38;
      }
      else {
        local_88.y = 0.0;
      }
      local_88.x = (float)(-(uint)(fVar35 != 3.4028235e+38) & (uint)fVar35);
      SetNextWindowContentSize(&local_88);
    }
    IVar33 = (p->OuterRect).Min;
    IVar3 = (p->OuterRect).Max;
    local_88.y = IVar3.y - IVar33.y;
    local_88.x = IVar3.x - IVar33.x;
    BeginChildEx(local_38,id_00,&local_88,false,(uVar10 & 0x100000) >> 9);
    pIVar6 = pIVar31->CurrentWindow;
    p->InnerWindow = pIVar6;
    IVar33 = (pIVar6->WorkRect).Max;
    (p->WorkRect).Min = (pIVar6->WorkRect).Min;
    (p->WorkRect).Max = IVar33;
    IVar33 = pIVar6->Pos;
    IVar7.y = (pIVar6->Size).y + IVar33.y;
    IVar7.x = (pIVar6->Size).x + IVar33.x;
    (p->OuterRect).Min = IVar33;
    (p->OuterRect).Max = IVar7;
  }
  PushOverrideID(id_00);
  this = local_50;
  local_78 = p->InnerWindow;
  p->HostIndentX = (local_78->DC).Indent.x;
  IVar33 = (local_78->ClipRect).Max;
  (p->HostClipRect).Min = (local_78->ClipRect).Min;
  (p->HostClipRect).Max = IVar33;
  p->HostSkipItems = local_78->SkipItems;
  IVar33 = (local_78->WorkRect).Max;
  (p->HostWorkRect).Min = (local_78->WorkRect).Min;
  (p->HostWorkRect).Max = IVar33;
  p->HostCursorMaxPos = (local_78->DC).CursorMaxPos;
  fVar35 = (pIVar31->Style).CellPadding.x;
  fVar34 = (pIVar31->Style).CellPadding.y;
  if ((uVar10 >> 10 & 1) == 0) {
    fVar38 = 0.0;
    fVar41 = 0.0;
    fVar36 = fVar35;
  }
  else {
    fVar38 = fVar35 + 1.0;
    fVar36 = 0.0;
    fVar41 = fVar35;
  }
  p->CellPaddingX1 = fVar38;
  p->CellPaddingX2 = fVar41;
  p->CellPaddingY = fVar34;
  p->CellSpacingX = fVar36;
  p->CurrentColumn = -1;
  p->CurrentRow = -1;
  p->RowBgColorCounter = 0;
  pIVar21 = &local_78->ClipRect;
  if (local_78 == pIVar5) {
    pIVar21 = &p->WorkRect;
  }
  *(uint *)&p->field_0x94 = (uint)*(ushort *)&p->field_0x94;
  IVar33 = pIVar21->Max;
  (p->InnerClipRect).Min = pIVar21->Min;
  (p->InnerClipRect).Max = IVar33;
  IVar33 = (p->WorkRect).Min;
  fVar35 = IVar33.x;
  fVar34 = IVar33.y;
  IVar33 = (p->InnerClipRect).Min;
  IVar3 = (p->HostClipRect).Min;
  fVar38 = IVar33.x;
  fVar36 = IVar33.y;
  uVar32 = -(uint)(fVar35 <= fVar38);
  uVar19 = -(uint)(fVar34 <= fVar36);
  uVar27 = CONCAT44(~uVar19 & (uint)fVar34,~uVar32 & (uint)fVar35) |
           CONCAT44((uint)fVar36 & uVar19,(uint)fVar38 & uVar32);
  fVar35 = IVar3.x;
  fVar38 = IVar3.y;
  fVar36 = (float)uVar27;
  fVar41 = (float)(uVar27 >> 0x20);
  uVar32 = -(uint)(fVar35 <= fVar36);
  uVar19 = -(uint)(fVar38 <= fVar41);
  (p->InnerClipRect).Min =
       (ImVec2)(CONCAT44(~uVar19 & (uint)fVar38,~uVar32 & (uint)fVar35) |
               CONCAT44((uint)fVar41 & uVar19,(uint)fVar36 & uVar32));
  auVar40._8_8_ = 0;
  auVar40._0_4_ = (p->WorkRect).Max.x;
  auVar40._4_4_ = (p->WorkRect).Max.y;
  auVar39._8_8_ = 0;
  auVar39._0_4_ = (p->InnerClipRect).Max.x;
  auVar39._4_4_ = (p->InnerClipRect).Max.y;
  auVar40 = minps(auVar39,auVar40);
  auVar37._8_8_ = 0;
  auVar37._0_4_ = (p->HostClipRect).Max.x;
  auVar37._4_4_ = (p->HostClipRect).Max.y;
  auVar40 = minps(auVar40,auVar37);
  pIVar21 = &local_78->ClipRect;
  if ((uVar10 >> 0x12 & 1) != 0) {
    pIVar21 = &p->WorkRect;
  }
  (p->InnerClipRect).Max = auVar40._0_8_;
  (p->InnerClipRect).Max.y = (pIVar21->Max).y;
  IVar33 = (p->InnerClipRect).Max;
  (p->BackgroundClipRect).Min = (p->InnerClipRect).Min;
  (p->BackgroundClipRect).Max = IVar33;
  p->RowPosY2 = fVar34;
  p->RowPosY1 = fVar34;
  p->RowTextBaseline = 0.0;
  bVar17 = (byte)(uVar10 >> 0x16) & 3;
  p->FreezeRowsRequest = bVar17;
  pfVar1 = &(local_78->Scroll).y;
  bVar23 = 0;
  if (*pfVar1 != 0.0) {
    bVar23 = bVar17;
  }
  if (NAN(*pfVar1)) {
    bVar23 = bVar17;
  }
  p->FreezeRowsCount = bVar23;
  bVar18 = (byte)(uVar10 >> 0x18) & 3;
  p->FreezeColumnsRequest = bVar18;
  bVar17 = 0;
  if ((local_78->Scroll).x != 0.0) {
    bVar17 = bVar18;
  }
  if (NAN((local_78->Scroll).x)) {
    bVar17 = bVar18;
  }
  p->FreezeColumnsCount = bVar17;
  p->IsFreezeRowsPassed = bVar23 == 0;
  p->DeclColumnsCount = '\0';
  p->RightMostVisibleColumn = -1;
  IVar12 = GetColorU32(0x2b,1.0);
  p->BorderColorStrong = IVar12;
  IVar12 = GetColorU32(0x2c,1.0);
  p->BorderColorLight = IVar12;
  fVar35 = (p->InnerClipRect).Max.x;
  p->BorderX1 = (p->InnerClipRect).Min.x;
  p->BorderX2 = fVar35;
  IVar13 = ImPool<ImGuiTable>::GetIndex(this,p);
  iVar14 = (pIVar31->CurrentTableStack).Size;
  if (iVar14 == (pIVar31->CurrentTableStack).Capacity) {
    if (iVar14 == 0) {
      iVar20 = 8;
    }
    else {
      iVar20 = iVar14 / 2 + iVar14;
    }
    iVar26 = iVar14 + 1;
    if (iVar14 + 1 < iVar20) {
      iVar26 = iVar20;
    }
    __dest = (ImGuiPtrOrIndex *)MemAlloc((long)iVar26 << 4);
    pIVar31 = local_70;
    __src = (local_70->CurrentTableStack).Data;
    if (__src != (ImGuiPtrOrIndex *)0x0) {
      memcpy(__dest,__src,(long)(local_70->CurrentTableStack).Size << 4);
      MemFree((pIVar31->CurrentTableStack).Data);
    }
    (pIVar31->CurrentTableStack).Data = __dest;
    (pIVar31->CurrentTableStack).Capacity = iVar26;
    iVar14 = (pIVar31->CurrentTableStack).Size;
  }
  else {
    __dest = (pIVar31->CurrentTableStack).Data;
  }
  __dest[iVar14].Ptr = (void *)0x0;
  __dest[iVar14].Index = IVar13;
  (pIVar31->CurrentTableStack).Size = (pIVar31->CurrentTableStack).Size + 1;
  pIVar31->CurrentTable = p;
  (pIVar5->DC).CurrentTable = p;
  if (((local_7c & 2) != 0) && ((uVar10 & 2) == 0)) {
    p->IsResetDisplayOrderRequest = true;
  }
  iVar14 = (int)((ulong)((long)(p->Columns).DataEnd - (long)(p->Columns).Data) >> 3) * -0x3b13b13b;
  if (iVar14 == columns_count || iVar14 == 0) {
    if ((p->RawData).Size == 0) goto LAB_001ec851;
    if ((p->IsSettingsRequestLoad & 1U) == 0) goto LAB_001eca57;
  }
  else {
    if ((p->RawData).Capacity < 0) {
      pcVar15 = (char *)MemAlloc(0);
      pcVar30 = (p->RawData).Data;
      if (pcVar30 != (char *)0x0) {
        memcpy(pcVar15,pcVar30,(long)(p->RawData).Size);
        MemFree((p->RawData).Data);
      }
      (p->RawData).Data = pcVar15;
      (p->RawData).Capacity = 0;
    }
    (p->RawData).Size = 0;
LAB_001ec851:
    iVar14 = (p->RawData).Capacity;
    iVar20 = columns_count * 0x71;
    if (SBORROW4(iVar14,iVar20) == iVar14 + columns_count * -0x71 < 0) {
      pIVar16 = (ImGuiTableColumn *)(p->RawData).Data;
    }
    else {
      if (iVar14 == 0) {
        iVar14 = 8;
      }
      else {
        iVar14 = iVar14 / 2 + iVar14;
      }
      if (iVar14 <= iVar20) {
        iVar14 = iVar20;
      }
      pIVar16 = (ImGuiTableColumn *)MemAlloc((long)iVar14);
      pcVar30 = (p->RawData).Data;
      if (pcVar30 != (char *)0x0) {
        memcpy(pIVar16,pcVar30,(long)(p->RawData).Size);
        MemFree((p->RawData).Data);
      }
      (p->RawData).Data = (char *)pIVar16;
      (p->RawData).Capacity = iVar14;
    }
    (p->RawData).Size = iVar20;
    pIVar25 = (ImGuiTableColumn *)((long)&(pIVar16->ClipRect).Min.x + (long)(columns_count * 0x68));
    (p->Columns).Data = pIVar16;
    (p->Columns).DataEnd = pIVar25;
    pIVar22 = (ImGuiTableCellData *)
              ((long)&(pIVar16->ClipRect).Min.x + (long)(columns_count * 0x69));
    (p->DisplayOrderToIndex).Data = (char *)pIVar25;
    (p->DisplayOrderToIndex).DataEnd = (char *)pIVar22;
    (p->RowCellData).Data = pIVar22;
    (p->RowCellData).DataEnd =
         (ImGuiTableCellData *)((long)&(pIVar16->ClipRect).Min.x + (long)iVar20);
    if (0 < columns_count) {
      lVar24 = 0x5a;
      uVar27 = 0;
      do {
        local_88._0_5_ = 0xff00000000;
        local_88.x = -NAN;
        pIVar16 = (p->Columns).Data;
        pIVar25 = (ImGuiTableColumn *)((long)pIVar16 + lVar24 + -0x5a);
        if ((p->Columns).DataEnd <= pIVar25) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        }
        *(undefined8 *)((long)pIVar16 + lVar24 + -0x4a) = 0;
        *(undefined8 *)((long)pIVar16 + lVar24 + -0x42) = 0;
        (pIVar25->ClipRect).Min.x = 0.0;
        (pIVar25->ClipRect).Min.y = 0.0;
        *(undefined8 *)((long)pIVar16 + lVar24 + -0x52) = 0;
        *(undefined8 *)((long)pIVar16 + lVar24 + -0x3a) = 0;
        *(undefined8 *)((long)pIVar16 + lVar24 + -0x32) = 0xbf800000bf800000;
        *(undefined4 *)((long)pIVar16 + lVar24 + -0x2a) = 0xbf800000;
        puVar2 = (undefined8 *)((long)pIVar16 + lVar24 + -0x26);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)pIVar16 + lVar24 + -0x16);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined8 *)((long)pIVar16 + lVar24 + -6) = 0xffff00000101ffff;
        *(float *)((long)&(pIVar16->ClipRect).Min.x + lVar24 + 2) = local_88.x;
        *(undefined1 *)((long)&(pIVar16->ClipRect).Min.y + lVar24 + 2) = local_88.y._0_1_;
        *(undefined4 *)((long)&(pIVar16->ClipRect).Min.y + lVar24 + 3) = 0xff0707;
        pcVar30 = (p->DisplayOrderToIndex).Data + uVar27;
        if ((p->DisplayOrderToIndex).DataEnd <= pcVar30) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        }
        *pcVar30 = (char)uVar27;
        pIVar16 = (p->Columns).Data;
        if ((p->Columns).DataEnd <= (ImGuiTableColumn *)((long)pIVar16 + lVar24 + -0x5a)) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        }
        *(char *)((long)&(pIVar16->ClipRect).Min.x + lVar24) = (char)uVar27;
        uVar27 = uVar27 + 1;
        lVar24 = lVar24 + 0x68;
      } while ((uint)columns_count != uVar27);
    }
    p->IsSettingsRequestLoad = true;
    p->IsInitializing = true;
    p->IsSortSpecsDirty = true;
    pIVar31 = local_70;
  }
  TableLoadSettings(p);
LAB_001eca57:
  fVar35 = pIVar31->FontSize;
  local_68._0_4_ = fVar35;
  fVar34 = p->RefScale;
  if ((fVar34 != 0.0) || (NAN(fVar34))) {
    if (((fVar34 != fVar35) || (NAN(fVar34) || NAN(fVar35))) && (0 < columns_count)) {
      lVar24 = 0;
      do {
        pIVar16 = (p->Columns).Data;
        pIVar25 = (p->Columns).DataEnd;
        pIVar28 = pIVar16;
        if (pIVar25 <= (ImGuiTableColumn *)((long)&(pIVar16->ClipRect).Min.x + lVar24)) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
          pIVar28 = (p->Columns).Data;
          pIVar25 = (p->Columns).DataEnd;
        }
        fVar38 = *(float *)((long)&pIVar16->WidthRequest + lVar24);
        if (pIVar25 <= (ImGuiTableColumn *)((long)&(pIVar28->ClipRect).Min.x + lVar24)) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        }
        *(float *)((long)&pIVar28->WidthRequest + lVar24) = fVar38 * (fVar35 / fVar34);
        lVar24 = lVar24 + 0x68;
      } while ((ulong)(uint)columns_count * 0x68 - lVar24 != 0);
    }
  }
  p->RefScale = (float)local_68._0_4_;
  local_78->SkipItems = true;
  TableBeginUpdateColumns(p);
  return true;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    if (use_child_window && IsClippedEx(outer_rect, 0, false))
    {
        ItemSize(outer_rect);
        return false;
    }

    flags = TableFixFlags(flags);
    if (outer_window->Flags & ImGuiWindowFlags_NoSavedSettings)
        flags |= ImGuiTableFlags_NoSavedSettings;

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const ImGuiTableFlags table_last_flags = table->Flags;
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->ColumnsNames.Buf.resize(0);
    table->IsInitializing = false;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    table->OuterRect = outer_rect;
    table->WorkRect = outer_rect;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Create scrolling region (without border = zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, table->OuterRect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
    }

    // Push a standardized ID for both child and not-child using tables, equivalent to BeginTable() doing PushID(label) matching
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    table->HostWorkRect = inner_window->WorkRect;
    table->HostCursorMaxPos = inner_window->DC.CursorMaxPos;

    // Borders
    // - None               ........Content..... Pad .....Content........
    // - OuterV             | Pad ..Content..... Pad .....Content.. Pad |       // FIXME-TABLE: Not handled properly
    // - InnerV             ........Content.. Pad | Pad ..Content........       // FIXME-TABLE: Not handled properly
    // - OuterV+InnerV      | Pad ..Content.. Pad | Pad ..Content.. Pad |

    const bool has_cell_padding_x = (flags & ImGuiTableFlags_BordersOuterV) != 0;
    table->CellPaddingX1 = has_cell_padding_x ? g.Style.CellPadding.x + 1.0f : 0.0f;
    table->CellPaddingX2 = has_cell_padding_x ? g.Style.CellPadding.x : 0.0f;
    table->CellPaddingY = g.Style.CellPadding.y;
    table->CellSpacingX = has_cell_padding_x ? 0.0f : g.Style.CellPadding.x;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWith(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? table->WorkRect.Max.y : inner_window->ClipRect.Max.y;
    table->BackgroundClipRect = table->InnerClipRect;
    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = (ImS8)((flags & ImGuiTableFlags_ScrollFreezeRowsMask_) >> ImGuiTableFlags_ScrollFreezeRowsShift_);
    table->FreezeRowsCount = (inner_window->Scroll.y != 0.0f) ? table->FreezeRowsRequest : 0;
    table->FreezeColumnsRequest = (ImS8)((flags & ImGuiTableFlags_ScrollFreezeColumnsMask_) >> ImGuiTableFlags_ScrollFreezeColumnsShift_);
    table->FreezeColumnsCount = (inner_window->Scroll.x != 0.0f) ? table->FreezeColumnsRequest : 0;
    table->IsFreezeRowsPassed = (table->FreezeRowsCount == 0);
    table->DeclColumnsCount = 0;
    table->RightMostVisibleColumn = -1;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // Make table current
    g.CurrentTableStack.push_back(ImGuiPtrOrIndex(g.Tables.GetIndex(table)));
    g.CurrentTable = table;
    outer_window->DC.CurrentTable = table;
    if ((table_last_flags & ImGuiTableFlags_Reorderable) && !(flags & ImGuiTableFlags_Reorderable))
        table->IsResetDisplayOrderRequest = true;

    // Setup default columns state. Clear data if columns count changed
    const int stored_size = table->Columns.size();
    if (stored_size != 0 && stored_size != columns_count)
        table->RawData.resize(0);
    if (table->RawData.Size == 0)
    {
        // Allocate single buffer for our arrays
        ImSpanAllocator<3> span_allocator;
        span_allocator.ReserveBytes(0, columns_count * sizeof(ImGuiTableColumn));
        span_allocator.ReserveBytes(1, columns_count * sizeof(ImS8));
        span_allocator.ReserveBytes(2, columns_count * sizeof(ImGuiTableCellData));
        table->RawData.resize(span_allocator.GetArenaSizeInBytes());
        span_allocator.SetArenaBasePtr(table->RawData.Data);
        span_allocator.GetSpan(0, &table->Columns);
        span_allocator.GetSpan(1, &table->DisplayOrderToIndex);
        span_allocator.GetSpan(2, &table->RowCellData);

        for (int n = 0; n < columns_count; n++)
        {
            table->Columns[n] = ImGuiTableColumn();
            table->Columns[n].DisplayOrder = table->DisplayOrderToIndex[n] = (ImS8)n;
        }
        table->IsInitializing = table->IsSettingsRequestLoad = table->IsSortSpecsDirty = true;
    }

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextCell() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Update/lock which columns will be Visible for the frame
    TableBeginUpdateColumns(table);

    return true;
}